

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitSIMDLoadSplat
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,SIMDLoad *curr)

{
  char **this_00;
  Literal *pLVar1;
  code *pcVar2;
  undefined1 local_d8 [8];
  Flow flow;
  Literal local_48;
  
  flow.breakTo.super_IString.str._M_str._0_4_ = 0xc;
  SIMDLoad::getMemBytes(curr);
  switch(curr->op) {
  case Load8SplatVec128:
    pcVar2 = Literal::splatI8x16;
    break;
  case Load16SplatVec128:
    pcVar2 = Literal::splatI16x8;
    break;
  case Load32SplatVec128:
    pcVar2 = Literal::splatI32x4;
    break;
  case Load64SplatVec128:
    pcVar2 = Literal::splatI64x2;
    break;
  default:
    handle_unreachable("invalid op",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                       ,0xc97);
  }
  this_00 = &flow.breakTo.super_IString.str._M_str;
  Load::finalize((Load *)this_00);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_d8,&this->super_ExpressionRunner<wasm::ModuleRunner>,
             (Expression *)this_00);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    pLVar1 = Flow::getSingleValue((Flow *)local_d8);
    (*pcVar2)(&local_48,pLVar1);
    Flow::Flow(__return_storage_ptr__,&local_48);
    Literal::~Literal(&local_48);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_d8);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_d8);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDLoadSplat(SIMDLoad* curr) {
    Load load;
    load.memory = curr->memory;
    load.type = Type::i32;
    load.bytes = curr->getMemBytes();
    load.signed_ = false;
    load.offset = curr->offset;
    load.align = curr->align;
    load.isAtomic = false;
    load.ptr = curr->ptr;
    Literal (Literal::*splat)() const = nullptr;
    switch (curr->op) {
      case Load8SplatVec128:
        splat = &Literal::splatI8x16;
        break;
      case Load16SplatVec128:
        splat = &Literal::splatI16x8;
        break;
      case Load32SplatVec128:
        splat = &Literal::splatI32x4;
        break;
      case Load64SplatVec128:
        load.type = Type::i64;
        splat = &Literal::splatI64x2;
        break;
      default:
        WASM_UNREACHABLE("invalid op");
    }
    load.finalize();
    Flow flow = self()->visit(&load);
    if (flow.breaking()) {
      return flow;
    }
    return (flow.getSingleValue().*splat)();
  }